

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int NET_ParseUrl(char *url,char *proto,char *host,int *port,char *fn)

{
  int iVar1;
  size_t sVar2;
  byte *__dest;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *__s;
  
  sVar2 = strlen(url);
  __dest = (byte *)malloc(sVar2 + 1);
  strcpy((char *)__dest,url);
  *port = 0x50;
  builtin_strncpy(proto,"http:",6);
  builtin_strncpy(host,"localhost",10);
  fn[0] = '/';
  fn[1] = '\0';
  pbVar3 = (byte *)strstr((char *)__dest,"http:");
  if (pbVar3 == (byte *)0x0) {
    pbVar3 = (byte *)strstr((char *)__dest,"root:");
    if (pbVar3 != (byte *)0x0) goto LAB_00138eb9;
    pbVar5 = (byte *)strstr((char *)__dest,"ftp:");
    pbVar3 = __dest;
    if (pbVar5 != (byte *)0x0) {
      iVar1 = 1;
      if (pbVar5 != __dest) goto LAB_00138ec3;
      builtin_strncpy(proto,"ftp:",5);
      *port = 0x15;
      pbVar3 = __dest + 4;
    }
  }
  else {
LAB_00138eb9:
    iVar1 = 1;
    if (pbVar3 != __dest) goto LAB_00138ec3;
    pbVar3 = __dest + 5;
  }
  if (*pbVar3 == 0x2f) {
    pbVar3 = pbVar3 + (ulong)(pbVar3[1] == 0x2f) * 2;
  }
  iVar1 = strcmp(proto,"http:");
  if (iVar1 == 0) {
    pcVar4 = strchr((char *)pbVar3,0x40);
    pbVar5 = (byte *)(pcVar4 + 1);
    if (pcVar4 == (char *)0x0) {
      pbVar5 = pbVar3;
    }
    uVar6 = 0;
    __s = pbVar5;
    while ((0x3a < (ulong)*__s || ((0x400800000000001U >> ((ulong)*__s & 0x3f) & 1) == 0))) {
      __s = __s + 1;
      uVar6 = uVar6 + 1;
    }
    iVar1 = 1;
    if (99 < uVar6) goto LAB_00138ec3;
    strncpy(host,(char *)pbVar5,uVar6);
    host[uVar6] = '\0';
    if (*__s == 0x3a) {
      __s = __s + 1;
      __isoc99_sscanf(__s,"%d",port);
      for (; (*__s != 0 && (*__s != 0x2f)); __s = __s + 1) {
      }
    }
  }
  else {
    for (uVar6 = 0; (pbVar3[uVar6] != 0 && (pbVar3[uVar6] != 0x2f)); uVar6 = uVar6 + 1) {
    }
    iVar1 = 1;
    if (99 < uVar6) goto LAB_00138ec3;
    __s = pbVar3 + uVar6;
    strncpy(host,(char *)pbVar3,uVar6);
    host[uVar6] = '\0';
  }
  iVar1 = 0;
  if (*__s != 0) {
    sVar2 = strlen((char *)__s);
    iVar1 = 1;
    if (sVar2 < 0x4b0) {
      strcpy(fn,(char *)__s);
      iVar1 = 0;
    }
  }
LAB_00138ec3:
  free(__dest);
  return iVar1;
}

Assistant:

static int NET_ParseUrl(const char *url, char *proto, char *host, int *port, 
		 char *fn)
{
  /* parses urls into their bits */
  /* returns 1 if error, else 0 */

  char *urlcopy, *urlcopyorig;
  char *ptrstr;
  char *thost;
  int isftp = 0;
  size_t icount;

  /* figure out if there is a http: or  ftp: */

  urlcopyorig = urlcopy = (char *) malloc(strlen(url)+1);
  strcpy(urlcopy,url);

  /* set some defaults */
  *port = 80;
  strcpy(proto,"http:");
  strcpy(host,"localhost");
  strcpy(fn,"/");
  
  ptrstr = strstr(urlcopy,"http:");
  if (ptrstr == NULL) {
    /* Nope, not http: */
    ptrstr = strstr(urlcopy,"root:");
    if (ptrstr == NULL) {
      /* Nope, not root either */
      ptrstr = strstr(urlcopy,"ftp:");
      if (ptrstr != NULL) {
	if (ptrstr == urlcopy) {
	  strcpy(proto,"ftp:");
	  *port = 21;
	  isftp++;
	  urlcopy += 4; /* move past ftp: */
	} else {
	  /* not at the beginning, bad url */
	  free(urlcopyorig);
	  return 1;
	}
      }
    } else {
      if (ptrstr == urlcopy) {
	urlcopy += 5; /* move past root: */
      } else {
	/* not at the beginning, bad url */
	free(urlcopyorig);
	return 1;
      }
    }
  } else {
    if (ptrstr == urlcopy) {
      urlcopy += 5; /* move past http: */
    } else {
      free(urlcopyorig);
      return 1;
    }
  }

  /* got the protocol */
  /* get the hostname */
  if (urlcopy[0] == '/' && urlcopy[1] == '/') {
    /* we have a hostname */
    urlcopy += 2; /* move past the // */
  }
  /* do this only if http */
  if (!strcmp(proto,"http:")) {

    /* Move past any user:password */
    if ((thost = strchr(urlcopy, '@')) != NULL)
      urlcopy = thost+1;

    thost = urlcopy;
    icount=0;
    while (*urlcopy != '/' && *urlcopy != ':' && *urlcopy) {
      urlcopy++;
      icount++;
    }
    if (icount > SHORTLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strncpy(host,thost,icount);
    host[icount] = '\0';
    
    /* we should either be at the end of the string, have a /, or have a : */
    if (*urlcopy == ':') {
      /* follows a port number */
      urlcopy++;
      sscanf(urlcopy,"%d",port);
      while (*urlcopy != '/' && *urlcopy) urlcopy++; /* step to the */
    }
  } else {
    /* do this for ftp */
    
    thost = urlcopy;
    icount = 0;
    while (*urlcopy != '/' && *urlcopy) {
      urlcopy++;
      icount++;
    }
    if (icount > SHORTLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strncpy(host,thost,icount);
    host[icount] = '\0';
    /* Now, we should either be at the end of the string, or have a / */
    
  }
  /* Now the rest is a fn */

  if (*urlcopy) {
    if (strlen(urlcopy) > MAXLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strcpy(fn,urlcopy);
  }
  free(urlcopyorig);
  return 0;
}